

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lts.c
# Opt level: O0

char * cst_substr(char *str,int start,int length)

{
  char *local_20;
  char *nstr;
  int length_local;
  int start_local;
  char *str_local;
  
  local_20 = (char *)0x0;
  if (str != (char *)0x0) {
    local_20 = (char *)__ckd_malloc__((long)(length + 1),
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                      ,0x59);
    strncpy(local_20,str + start,(long)length);
    local_20[length] = '\0';
  }
  return local_20;
}

Assistant:

static char *
cst_substr(const char *str, int start, int length)
{
    char *nstr = NULL;

    if (str) {
        nstr = ckd_malloc(length + 1);
        strncpy(nstr, str + start, length);
        nstr[length] = '\0';
    }
    return nstr;
}